

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultMpeg4Gif.h
# Opt level: O0

void __thiscall
TgBot::InlineQueryResultMpeg4Gif::InlineQueryResultMpeg4Gif(InlineQueryResultMpeg4Gif *this)

{
  InlineQueryResultMpeg4Gif *this_local;
  
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultMpeg4Gif_0051b530;
  std::__cxx11::string::string((string *)&this->mpeg4Url);
  std::__cxx11::string::string((string *)&this->thumbUrl);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InlineQueryResult).type,(string *)&TYPE_abi_cxx11_);
  this->mpeg4Width = 0;
  this->mpeg4Height = 0;
  return;
}

Assistant:

InlineQueryResultMpeg4Gif() {
        this->type = TYPE;
        this->mpeg4Width = 0;
        this->mpeg4Height = 0;
    }